

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<kj::Array<char>_> *
kj::parse::Times_<const_kj::parse::Any__&>::Impl<kj::parse::IteratorInput<char,_const_char_*>,_char>
::apply(Maybe<kj::Array<char>_> *__return_storage_ptr__,Any_ *subParser,uint count,
       IteratorInput<char,_const_char_*> *input)

{
  char *pcVar1;
  char *ptrCopy;
  char *firstElement;
  size_t elementCount;
  ulong capacity;
  
  capacity = (ulong)count;
  firstElement = (char *)kj::_::HeapArrayDisposer::allocateImpl
                                   (1,0,capacity,(_func_void_void_ptr *)0x0,
                                    (_func_void_void_ptr *)0x0);
  if (count != 0) {
    elementCount = 0;
    do {
      pcVar1 = input->pos;
      if (pcVar1 == input->end) {
        (__return_storage_ptr__->ptr).isSet = false;
        if (firstElement == (char *)0x0) {
          return __return_storage_ptr__;
        }
        kj::_::HeapArrayDisposer::disposeImpl
                  ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,1,
                   elementCount,capacity,(_func_void_void_ptr *)0x0);
        return __return_storage_ptr__;
      }
      input->pos = pcVar1 + 1;
      firstElement[elementCount] = *pcVar1;
      elementCount = elementCount + 1;
    } while (elementCount < capacity);
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = firstElement;
  (__return_storage_ptr__->ptr).field_1.value.size_ = capacity;
  (__return_storage_ptr__->ptr).field_1.value.disposer =
       (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, uint count, Input& input) {
    auto results = heapArrayBuilder<OutputType<SubParser, Input>>(count);

    while (results.size() < count) {
      if (input.atEnd()) {
        return nullptr;
      } else KJ_IF_MAYBE(subResult, subParser(input)) {
        results.add(kj::mv(*subResult));
      } else {
        return nullptr;
      }
    }

    return results.finish();
  }